

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_escape(runtime_type *this,var *b)

{
  bool bVar1;
  pointer *this_00;
  undefined8 uVar2;
  runtime_error *this_01;
  proxy *in_RDI;
  pointer *ptr;
  string *in_stack_ffffffffffffff48;
  runtime_error *in_stack_ffffffffffffff50;
  type_info *in_stack_ffffffffffffff58;
  allocator *paVar3;
  type_info *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [16];
  any *in_stack_ffffffffffffffd0;
  
  cs_impl::any::type((any *)in_stack_ffffffffffffff50);
  bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (!bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar3 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Unsupported operator operations(Escape).",paVar3);
    runtime_error::runtime_error(this_01,in_stack_ffffffffffffff48);
    __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  this_00 = cs_impl::any::const_val<cs::pointer>(in_stack_ffffffffffffffd0);
  bVar1 = cs_impl::any::usable(&this_00->data);
  if (!bVar1) {
    local_55 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Escape from null pointer.",&local_41);
    runtime_error::runtime_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_55 = 0;
    __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  cs_impl::any::any((any *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_escape(const var &b)
	{
		if (b.type() == typeid(pointer)) {
			const auto &ptr = b.const_val<pointer>();
			if (ptr.data.usable())
				return ptr.data;
			else
				throw runtime_error("Escape from null pointer.");
		}
		else
			throw runtime_error("Unsupported operator operations(Escape).");
	}